

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiNode *pNode)

{
  bool bVar1;
  reference rVar2;
  uint local_7c;
  undefined1 auStack_78 [4];
  uint i_1;
  _Bit_type local_70;
  reference local_68;
  uint local_58;
  uint i;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> abHadMesh;
  char *nodeName;
  aiNode *pNode_local;
  ValidateDSProcess *this_local;
  
  if (pNode == (aiNode *)0x0) {
    ReportError(this,"A node of the scenegraph is NULL");
  }
  Validate(this,&pNode->mName);
  abHadMesh.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)aiString::C_Str(&pNode->mName);
  if ((pNode != this->mScene->mRootNode) && (pNode->mParent == (aiNode *)0x0)) {
    ReportError(this,"Non-root node %s lacks a valid parent (aiNode::mParent is NULL) ",
                abHadMesh.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
  }
  if (pNode->mNumMeshes != 0) {
    if (pNode->mMeshes == (uint *)0x0) {
      ReportError(this,"aiNode::mMeshes is NULL for node %s (aiNode::mNumMeshes is %i)",
                  abHadMesh.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,(ulong)pNode->mNumMeshes);
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_48);
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)this->mScene->mNumMeshes,false
              );
    for (local_58 = 0; local_58 < pNode->mNumMeshes; local_58 = local_58 + 1) {
      if (this->mScene->mNumMeshes <= pNode->mMeshes[local_58]) {
        ReportError(this,"aiNode::mMeshes[%i] is out of range for node %s (maximum is %i)",
                    (ulong)pNode->mMeshes[local_58],
                    abHadMesh.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,(ulong)(this->mScene->mNumMeshes - 1)
                   );
      }
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_48,
                         (ulong)pNode->mMeshes[local_58]);
      local_68 = rVar2;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      if (bVar1) {
        ReportError(this,"aiNode::mMeshes[%i] is already referenced by this node %s (value: %i)",
                    (ulong)local_58,
                    abHadMesh.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,(ulong)pNode->mMeshes[local_58]);
      }
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_48,
                         (ulong)pNode->mMeshes[local_58]);
      _auStack_78 = rVar2;
      std::_Bit_reference::operator=((_Bit_reference *)auStack_78,true);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_48);
  }
  if (pNode->mNumChildren != 0) {
    if (pNode->mChildren == (aiNode **)0x0) {
      ReportError(this,"aiNode::mChildren is NULL for node %s (aiNode::mNumChildren is %i)",
                  abHadMesh.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,(ulong)pNode->mNumChildren);
    }
    for (local_7c = 0; local_7c < pNode->mNumChildren; local_7c = local_7c + 1) {
      Validate(this,pNode->mChildren[local_7c]);
    }
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiNode* pNode)
{
    if (!pNode) {
    	ReportError("A node of the scenegraph is NULL");
    }
    // Validate node name string first so that it's safe to use in below expressions
    this->Validate(&pNode->mName);
    const char* nodeName = (&pNode->mName)->C_Str();
    if (pNode != mScene->mRootNode && !pNode->mParent){
        ReportError("Non-root node %s lacks a valid parent (aiNode::mParent is NULL) ", nodeName);
    }

    // validate all meshes
    if (pNode->mNumMeshes)
    {
        if (!pNode->mMeshes)
        {
            ReportError("aiNode::mMeshes is NULL for node %s (aiNode::mNumMeshes is %i)",
            		  nodeName, pNode->mNumMeshes);
        }
        std::vector<bool> abHadMesh;
        abHadMesh.resize(mScene->mNumMeshes,false);
        for (unsigned int i = 0; i < pNode->mNumMeshes;++i)
        {
            if (pNode->mMeshes[i] >= mScene->mNumMeshes)
            {
                ReportError("aiNode::mMeshes[%i] is out of range for node %s (maximum is %i)",
                    pNode->mMeshes[i], nodeName, mScene->mNumMeshes-1);
            }
            if (abHadMesh[pNode->mMeshes[i]])
            {
                ReportError("aiNode::mMeshes[%i] is already referenced by this node %s (value: %i)",
                    i, nodeName, pNode->mMeshes[i]);
            }
            abHadMesh[pNode->mMeshes[i]] = true;
        }
    }
    if (pNode->mNumChildren)
    {
        if (!pNode->mChildren)  {
            ReportError("aiNode::mChildren is NULL for node %s (aiNode::mNumChildren is %i)",
            		nodeName, pNode->mNumChildren);
        }
        for (unsigned int i = 0; i < pNode->mNumChildren;++i)   {
            Validate(pNode->mChildren[i]);
        }
    }
}